

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall cmMakefileTargetGenerator::WriteTargetBuildRules(cmMakefileTargetGenerator *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmMakefile *pcVar1;
  pointer pbVar2;
  __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
  _Var3;
  size_type sVar4;
  pointer ppcVar5;
  bool bVar6;
  string *config;
  char *pcVar7;
  string *psVar8;
  cmCustomCommand *cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar10;
  cmCompiledGeneratorExpression *pcVar11;
  pointer pbVar12;
  string *output;
  pointer ppcVar13;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> extraSources;
  string currentBinDir;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> headerSources;
  string local_1b8;
  cmCompiledGeneratorExpression *local_190;
  cmCompiledGeneratorExpression *local_188;
  string local_180;
  string *local_160;
  _Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_158;
  _Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_138;
  _Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_118;
  cmListFileBacktrace local_f8;
  undefined1 local_e8 [152];
  string local_50;
  
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e8,"CMAKE_BUILD_TYPE",(allocator<char> *)&local_180);
  config = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_e8);
  std::__cxx11::string::~string((string *)local_e8);
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e8,"ADDITIONAL_MAKE_CLEAN_FILES",(allocator<char> *)&local_180);
  pcVar7 = cmMakefile::GetProperty(pcVar1,(string *)local_e8);
  std::__cxx11::string::~string((string *)local_e8);
  if (pcVar7 != (char *)0x0) {
    local_f8.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_f8.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)&local_180,&local_f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_f8.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&local_1b8,(char *)&local_180);
    local_e8._0_8_ = local_e8 + 0x10;
    local_e8._8_8_ = (pointer)0x0;
    local_e8._16_8_ = local_e8._16_8_ & 0xffffffffffffff00;
    psVar8 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)local_1b8._M_dataplus._M_p,
                        (cmLocalGenerator *)this->LocalGenerator,config,false,
                        (this->super_cmCommonTargetGenerator).GeneratorTarget,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                        (string *)local_e8);
    cmSystemTools::ExpandListArgument(psVar8,&this->CleanFiles,false);
    std::__cxx11::string::~string((string *)local_e8);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&local_1b8);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&local_180);
  }
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e8,"CLEAN_NO_CUSTOM",(allocator<char> *)&local_180);
  pcVar7 = cmMakefile::GetProperty(pcVar1,(string *)local_e8);
  std::__cxx11::string::~string((string *)local_e8);
  bVar6 = cmSystemTools::IsOff(pcVar7);
  local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetCustomCommands
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_118,
             config);
  psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)this->LocalGenerator);
  std::__cxx11::string::string((string *)&local_180,(string *)psVar8);
  local_190 = (cmCompiledGeneratorExpression *)local_118._M_impl.super__Vector_impl_data._M_finish;
  local_160 = (string *)&(this->super_cmCommonTargetGenerator).ConfigName;
  this_00 = &this->CleanFiles;
  pcVar11 = (cmCompiledGeneratorExpression *)local_118._M_impl.super__Vector_impl_data._M_start;
  while (pcVar11 != local_190) {
    local_188 = pcVar11;
    cc = cmSourceFile::GetCustomCommand
                   ((cmSourceFile *)
                    (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&pcVar11->Backtrace)->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::string((string *)&local_50,local_160);
    cmCustomCommandGenerator::cmCustomCommandGenerator
              ((cmCustomCommandGenerator *)local_e8,cc,&local_50,
               (cmLocalGenerator *)this->LocalGenerator);
    std::__cxx11::string::~string((string *)&local_50);
    GenerateCustomRuleFile(this,(cmCustomCommandGenerator *)local_e8);
    if (bVar6) {
      pvVar9 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_((cmCustomCommandGenerator *)local_e8)
      ;
      pbVar2 = (pvVar9->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar12 = (pvVar9->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar2;
          pbVar12 = pbVar12 + 1) {
        cmLocalGenerator::MaybeConvertToRelativePath
                  (&local_1b8,(cmLocalGenerator *)this->LocalGenerator,&local_180,pbVar12);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   &local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
      }
      pvVar9 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                         ((cmCustomCommandGenerator *)local_e8);
      pbVar2 = (pvVar9->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar12 = (pvVar9->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar2;
          pbVar12 = pbVar12 + 1) {
        cmLocalGenerator::MaybeConvertToRelativePath
                  (&local_1b8,(cmLocalGenerator *)this->LocalGenerator,&local_180,pbVar12);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   &local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
      }
    }
    cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_e8);
    pcVar11 = (cmCompiledGeneratorExpression *)
              &(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_188->Backtrace)->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
  }
  if (bVar6) {
    pvVar10 = cmGeneratorTarget::GetPreBuildCommands
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector
              ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&local_1b8,pvVar10);
    sVar4 = local_1b8._M_string_length;
    pvVar10 = cmGeneratorTarget::GetPreLinkCommands
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    _Var3._M_current =
         (pvVar10->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
         super__Vector_impl_data._M_start;
    pvVar10 = cmGeneratorTarget::GetPreLinkCommands
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>::
    insert<__gnu_cxx::__normal_iterator<cmCustomCommand_const*,std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>>,void>
              ((vector<cmCustomCommand,std::allocator<cmCustomCommand>> *)&local_1b8,
               (const_iterator)sVar4,_Var3,
               (pvVar10->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    sVar4 = local_1b8._M_string_length;
    pvVar10 = cmGeneratorTarget::GetPostBuildCommands
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    _Var3._M_current =
         (pvVar10->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
         super__Vector_impl_data._M_start;
    pvVar10 = cmGeneratorTarget::GetPostBuildCommands
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>::
    insert<__gnu_cxx::__normal_iterator<cmCustomCommand_const*,std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>>,void>
              ((vector<cmCustomCommand,std::allocator<cmCustomCommand>> *)&local_1b8,
               (const_iterator)sVar4,_Var3,
               (pvVar10->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    local_190 = (cmCompiledGeneratorExpression *)local_1b8._M_string_length;
    while ((cmCompiledGeneratorExpression *)local_1b8._M_dataplus._M_p != local_190) {
      local_188 = (cmCompiledGeneratorExpression *)local_1b8._M_dataplus._M_p;
      pvVar9 = cmCustomCommand::GetByproducts_abi_cxx11_
                         ((cmCustomCommand *)local_1b8._M_dataplus._M_p);
      pbVar2 = (pvVar9->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar12 = (pvVar9->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar2;
          pbVar12 = pbVar12 + 1) {
        cmLocalGenerator::MaybeConvertToRelativePath
                  ((string *)local_e8,(cmLocalGenerator *)this->LocalGenerator,&local_180,pbVar12);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (string *)local_e8);
        std::__cxx11::string::~string((string *)local_e8);
      }
      local_1b8._M_dataplus._M_p =
           (pointer)&(local_188->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
    }
    std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::~vector
              ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&local_1b8);
  }
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (pointer)0x0;
  local_e8._16_8_ = 0;
  cmGeneratorTarget::GetHeaderSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_e8,config)
  ;
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (this->OSXBundleGenerator,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_e8,
             &this->MacOSXContentGenerator->super_MacOSXContentGeneratorType);
  local_1b8._M_dataplus._M_p = (pointer)0x0;
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_allocated_capacity = 0;
  cmGeneratorTarget::GetExtraSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_1b8,
             config);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (this->OSXBundleGenerator,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_1b8,
             &this->MacOSXContentGenerator->super_MacOSXContentGeneratorType);
  local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetExternalObjects
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_138,
             config);
  ppcVar5 = local_138._M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar13 = local_138._M_impl.super__Vector_impl_data._M_start; ppcVar13 != ppcVar5;
      ppcVar13 = ppcVar13 + 1) {
    psVar8 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar13);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->ExternalObjects,psVar8);
  }
  local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetObjectSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_158,
             config);
  ppcVar5 = local_158._M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar13 = local_158._M_impl.super__Vector_impl_data._M_start; ppcVar13 != ppcVar5;
      ppcVar13 = ppcVar13 + 1) {
    WriteObjectRuleFiles(this,*ppcVar13);
  }
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&local_158);
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&local_138);
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            ((_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_1b8
            );
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            ((_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_e8);
  std::__cxx11::string::~string((string *)&local_180);
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&local_118);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetBuildRules()
{
  const std::string& config =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");

  // write the custom commands for this target
  // Look for files registered for cleaning in this directory.
  if (const char* additional_clean_files =
        this->Makefile->GetProperty("ADDITIONAL_MAKE_CLEAN_FILES")) {
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(additional_clean_files);

    cmSystemTools::ExpandListArgument(
      cge->Evaluate(this->LocalGenerator, config, false, this->GeneratorTarget,
                    nullptr, nullptr),
      this->CleanFiles);
  }

  // add custom commands to the clean rules?
  const char* clean_no_custom = this->Makefile->GetProperty("CLEAN_NO_CUSTOM");
  bool clean = cmSystemTools::IsOff(clean_no_custom);

  // First generate the object rule files.  Save a list of all object
  // files for this target.
  std::vector<cmSourceFile const*> customCommands;
  this->GeneratorTarget->GetCustomCommands(customCommands, config);
  std::string currentBinDir =
    this->LocalGenerator->GetCurrentBinaryDirectory();
  for (cmSourceFile const* sf : customCommands) {
    cmCustomCommandGenerator ccg(*sf->GetCustomCommand(), this->ConfigName,
                                 this->LocalGenerator);
    this->GenerateCustomRuleFile(ccg);
    if (clean) {
      const std::vector<std::string>& outputs = ccg.GetOutputs();
      for (std::string const& output : outputs) {
        this->CleanFiles.push_back(
          this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir,
                                                           output));
      }
      const std::vector<std::string>& byproducts = ccg.GetByproducts();
      for (std::string const& byproduct : byproducts) {
        this->CleanFiles.push_back(
          this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir,
                                                           byproduct));
      }
    }
  }

  // Add byproducts from build events to the clean rules
  if (clean) {
    std::vector<cmCustomCommand> buildEventCommands =
      this->GeneratorTarget->GetPreBuildCommands();

    buildEventCommands.insert(
      buildEventCommands.end(),
      this->GeneratorTarget->GetPreLinkCommands().begin(),
      this->GeneratorTarget->GetPreLinkCommands().end());
    buildEventCommands.insert(
      buildEventCommands.end(),
      this->GeneratorTarget->GetPostBuildCommands().begin(),
      this->GeneratorTarget->GetPostBuildCommands().end());

    for (const auto& be : buildEventCommands) {
      const std::vector<std::string>& byproducts = be.GetByproducts();
      for (std::string const& byproduct : byproducts) {
        this->CleanFiles.push_back(
          this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir,
                                                           byproduct));
      }
    }
  }
  std::vector<cmSourceFile const*> headerSources;
  this->GeneratorTarget->GetHeaderSources(headerSources, config);
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    headerSources, this->MacOSXContentGenerator);
  std::vector<cmSourceFile const*> extraSources;
  this->GeneratorTarget->GetExtraSources(extraSources, config);
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    extraSources, this->MacOSXContentGenerator);
  std::vector<cmSourceFile const*> externalObjects;
  this->GeneratorTarget->GetExternalObjects(externalObjects, config);
  for (cmSourceFile const* sf : externalObjects) {
    this->ExternalObjects.push_back(sf->GetFullPath());
  }
  std::vector<cmSourceFile const*> objectSources;
  this->GeneratorTarget->GetObjectSources(objectSources, config);
  for (cmSourceFile const* sf : objectSources) {
    // Generate this object file's rule file.
    this->WriteObjectRuleFiles(*sf);
  }
}